

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall FPolyObj::ClearSubsectorLinks(FPolyObj *this)

{
  FPolyNode *pFVar1;
  FPolyNode *pFVar2;
  FMiniBSP *pFVar3;
  FPolyNode *pFVar4;
  FPolyNode *pFVar5;
  
  pFVar4 = this->subsectorlinks;
  while( true ) {
    if (pFVar4 == (FPolyNode *)0x0) {
      this->subsectorlinks = (FPolyNode *)0x0;
      return;
    }
    if (pFVar4->state != 0x539) break;
    pFVar1 = pFVar4->pnext;
    pFVar2 = pFVar4->snext;
    if (pFVar1 != (FPolyNode *)0x0) {
      if (pFVar1->state != 0x539) {
        __assert_fail("subsectorlinks->pnext->state == 1337",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                      ,0x71c,"void FPolyObj::ClearSubsectorLinks()");
      }
      pFVar1->pprev = pFVar4->pprev;
    }
    pFVar5 = pFVar4->pprev;
    if (pFVar5 == (FPolyNode *)0x0) {
      pFVar5 = (FPolyNode *)pFVar4->subsector;
    }
    else if (pFVar5->state != 0x539) {
      __assert_fail("subsectorlinks->pprev->state == 1337",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                    ,0x722,"void FPolyObj::ClearSubsectorLinks()");
    }
    pFVar5->pnext = pFVar1;
    pFVar3 = pFVar4->subsector->BSP;
    if (pFVar3 != (FMiniBSP *)0x0) {
      pFVar3->bDirty = true;
    }
    pFVar4->state = -1;
    TArray<FPolySeg,_FPolySeg>::~TArray(&pFVar4->segs);
    operator_delete(pFVar4,0x40);
    this->subsectorlinks = pFVar2;
    pFVar4 = pFVar2;
  }
  __assert_fail("subsectorlinks->state == 1337",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                ,0x716,"void FPolyObj::ClearSubsectorLinks()");
}

Assistant:

void FPolyObj::ClearSubsectorLinks()
{
	while (subsectorlinks != NULL)
	{
		assert(subsectorlinks->state == 1337);

		FPolyNode *next = subsectorlinks->snext;

		if (subsectorlinks->pnext != NULL)
		{
			assert(subsectorlinks->pnext->state == 1337);
			subsectorlinks->pnext->pprev = subsectorlinks->pprev;
		}

		if (subsectorlinks->pprev != NULL)
		{
			assert(subsectorlinks->pprev->state == 1337);
			subsectorlinks->pprev->pnext = subsectorlinks->pnext;
		}
		else
		{
			subsectorlinks->subsector->polys = subsectorlinks->pnext;
		}

		if (subsectorlinks->subsector->BSP != NULL)
		{
			subsectorlinks->subsector->BSP->bDirty = true;
		}

		subsectorlinks->state = -1;
		delete subsectorlinks;
		subsectorlinks = next;
	}
	subsectorlinks = NULL;
}